

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void emit_code(FILE *out,rule *rp,lemon *lemp,int *lineno)

{
  char *pcVar1;
  FILE *in_RCX;
  long in_RDX;
  long in_RSI;
  FILE *in_RDI;
  char *cp;
  char *in_stack_ffffffffffffffd8;
  
  if ((*(long *)(in_RSI + 0x40) != 0) && (**(char **)(in_RSI + 0x40) != '\0')) {
    fprintf(in_RDI,"{%s",*(undefined8 *)(in_RSI + 0x40));
    for (in_stack_ffffffffffffffd8 = *(char **)(in_RSI + 0x40); *in_stack_ffffffffffffffd8 != '\0';
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 1) {
      if (*in_stack_ffffffffffffffd8 == '\n') {
        in_RCX->_flags = in_RCX->_flags + 1;
      }
    }
  }
  if (*(long *)(in_RSI + 0x38) != 0) {
    if (*(int *)(in_RDX + 0x114) == 0) {
      in_RCX->_flags = in_RCX->_flags + 1;
      tplt_linedir(in_RCX,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(char *)0x111839);
    }
    fprintf(in_RDI,"{%s",*(undefined8 *)(in_RSI + 0x38));
    for (pcVar1 = *(char **)(in_RSI + 0x38); *pcVar1 != '\0'; pcVar1 = pcVar1 + 1) {
      if (*pcVar1 == '\n') {
        in_RCX->_flags = in_RCX->_flags + 1;
      }
    }
    fprintf(in_RDI,"}\n");
    in_RCX->_flags = in_RCX->_flags + 1;
    if (*(int *)(in_RDX + 0x114) == 0) {
      in_RCX->_flags = in_RCX->_flags + 1;
      tplt_linedir(in_RCX,(int)((ulong)pcVar1 >> 0x20),(char *)0x1118e9);
    }
  }
  if ((*(long *)(in_RSI + 0x48) != 0) && (**(char **)(in_RSI + 0x48) != '\0')) {
    fprintf(in_RDI,"%s",*(undefined8 *)(in_RSI + 0x48));
    for (pcVar1 = *(char **)(in_RSI + 0x48); *pcVar1 != '\0'; pcVar1 = pcVar1 + 1) {
      if (*pcVar1 == '\n') {
        in_RCX->_flags = in_RCX->_flags + 1;
      }
    }
  }
  if (*(long *)(in_RSI + 0x40) != 0) {
    fprintf(in_RDI,"}\n");
    in_RCX->_flags = in_RCX->_flags + 1;
  }
  return;
}

Assistant:

PRIVATE void emit_code(
  FILE *out,
  struct rule *rp,
  struct lemon *lemp,
  int *lineno
){
 const char *cp;

 /* Setup code prior to the #line directive */
 if( rp->codePrefix && rp->codePrefix[0] ){
   fprintf(out, "{%s", rp->codePrefix);
   for(cp=rp->codePrefix; *cp; cp++){ if( *cp=='\n' ) (*lineno)++; }
 }

 /* Generate code to do the reduce action */
 if( rp->code ){
   if( !lemp->nolinenosflag ){
     (*lineno)++;
     tplt_linedir(out,rp->line,lemp->filename);
   }
   fprintf(out,"{%s",rp->code);
   for(cp=rp->code; *cp; cp++){ if( *cp=='\n' ) (*lineno)++; }
   fprintf(out,"}\n"); (*lineno)++;
   if( !lemp->nolinenosflag ){
     (*lineno)++;
     tplt_linedir(out,*lineno,lemp->outname);
   }
 }

 /* Generate breakdown code that occurs after the #line directive */
 if( rp->codeSuffix && rp->codeSuffix[0] ){
   fprintf(out, "%s", rp->codeSuffix);
   for(cp=rp->codeSuffix; *cp; cp++){ if( *cp=='\n' ) (*lineno)++; }
 }

 if( rp->codePrefix ){
   fprintf(out, "}\n"); (*lineno)++;
 }

 return;
}